

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ActivationPReLU::ByteSizeLong(ActivationPReLU *this)

{
  size_t sVar1;
  
  if (this->alpha_ == (WeightParams *)0x0 ||
      this == (ActivationPReLU *)&_ActivationPReLU_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->alpha_);
    sVar1 = sVar1 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t ActivationPReLU::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ActivationPReLU)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams alpha = 1;
  if (this->has_alpha()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->alpha_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}